

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O1

void __thiscall ConnmanTestMsg::AddTestNode(ConnmanTestMsg *this,CNode *node)

{
  uint *puVar1;
  Network NVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  CNode *local_30;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->super_CConnman).m_nodes_mutex.super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  local_30 = node;
  std::vector<CNode*,std::allocator<CNode*>>::emplace_back<CNode*>
            ((vector<CNode*,std::allocator<CNode*>> *)&(this->super_CConnman).m_nodes,&local_30);
  if (ADDR_FETCH < node->m_conn_type) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.h"
                  ,0x319,"bool CNode::IsManualOrFullOutboundConn() const");
  }
  if ((0x39U >> (node->m_conn_type & 0x1f) & 1) == 0) {
    NVar2 = CNetAddr::GetNetwork((CNetAddr *)&node->addr);
    puVar1 = (this->super_CConnman).m_network_conn_counts._M_elems + NVar2;
    *puVar1 = *puVar1 + 1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddTestNode(CNode& node)
    {
        LOCK(m_nodes_mutex);
        m_nodes.push_back(&node);

        if (node.IsManualOrFullOutboundConn()) ++m_network_conn_counts[node.addr.GetNetwork()];
    }